

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O1

ValueEntry * __thiscall rsg::ValueScope::findEntry(ValueScope *this,Variable *variable)

{
  __normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
  _Var1;
  ValueEntry *pVVar2;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<rsg::ValueEntry*const*,std::vector<rsg::ValueEntry*,std::allocator<rsg::ValueEntry*>>>,__gnu_cxx::__ops::_Iter_equals_val<rsg::CompareEntryVariable_const>>
                    ((this->m_entries).
                     super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (this->m_entries).
                     super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  if (_Var1._M_current ==
      (this->m_entries).super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pVVar2 = (ValueEntry *)0x0;
  }
  else {
    pVVar2 = *_Var1._M_current;
  }
  return pVVar2;
}

Assistant:

ValueEntry* ValueScope::findEntry (const Variable* variable) const
{
	vector<ValueEntry*>::const_iterator pos = std::find(m_entries.begin(), m_entries.end(), CompareEntryVariable(variable));
	return pos != m_entries.end() ? *pos : DE_NULL;
}